

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerReflection::emit_type_array(CompilerReflection *this,SPIRType *type)

{
  bool bVar1;
  element_type *peVar2;
  SmallVector<bool,_8UL> *this_00;
  bool *pbVar3;
  bool *value_1;
  bool *__end2_1;
  bool *__begin2_1;
  SmallVector<bool,_8UL> *__range2_1;
  string local_90;
  uint32_t *local_70;
  uint *value;
  uint *__end2;
  uint *__begin2;
  SmallVector<unsigned_int,_8UL> *__range2;
  allocator local_39;
  string local_38;
  SPIRType *local_18;
  SPIRType *type_local;
  CompilerReflection *this_local;
  
  local_18 = type;
  type_local = (SPIRType *)this;
  bVar1 = Compiler::is_physical_pointer((Compiler *)this,type);
  if (!bVar1) {
    bVar1 = VectorView<unsigned_int>::empty(&(local_18->array).super_VectorView<unsigned_int>);
    if (!bVar1) {
      peVar2 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_38,"array",&local_39);
      simple_json::Stream::emit_json_key_array(peVar2,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
      __begin2 = (uint *)&local_18->array;
      __end2 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin2);
      value = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin2);
      for (; __end2 != value; __end2 = __end2 + 1) {
        local_70 = __end2;
        peVar2 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        simple_json::Stream::emit_json_array_value(peVar2,*local_70);
      }
      peVar2 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      simple_json::Stream::end_json_array(peVar2);
      peVar2 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_90,"array_size_is_literal",(allocator *)((long)&__range2_1 + 7));
      simple_json::Stream::emit_json_key_array(peVar2,&local_90);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
      this_00 = &local_18->array_size_literal;
      __end2_1 = VectorView<bool>::begin(&this_00->super_VectorView<bool>);
      pbVar3 = VectorView<bool>::end(&this_00->super_VectorView<bool>);
      for (; __end2_1 != pbVar3; __end2_1 = __end2_1 + 1) {
        peVar2 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        simple_json::Stream::emit_json_array_value(peVar2,(bool)(*__end2_1 & 1));
      }
      peVar2 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      simple_json::Stream::end_json_array(peVar2);
    }
  }
  return;
}

Assistant:

void CompilerReflection::emit_type_array(const SPIRType &type)
{
	if (!is_physical_pointer(type) && !type.array.empty())
	{
		json_stream->emit_json_key_array("array");
		// Note that we emit the zeros here as a means of identifying
		// unbounded arrays.  This is necessary as otherwise there would
		// be no way of differentiating between float[4] and float[4][]
		for (const auto &value : type.array)
			json_stream->emit_json_array_value(value);
		json_stream->end_json_array();

		json_stream->emit_json_key_array("array_size_is_literal");
		for (const auto &value : type.array_size_literal)
			json_stream->emit_json_array_value(value);
		json_stream->end_json_array();
	}
}